

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void DerefSentTimestep(SstStream Stream,WS_ReaderInfo Reader,ssize_t Timestep)

{
  long Timestep_00;
  CP_DP_PerReaderReleaseTimestepFunc p_Var1;
  _SentTimestepRec **pp_Var2;
  int SetLast;
  _SentTimestepRec *p_Var3;
  _SentTimestepRec *p_Var4;
  _SentTimestepRec *ItemToFree;
  _SentTimestepRec *__ptr;
  _SentTimestepRec *p_Var5;
  
  __ptr = Reader->SentTimestepList;
  CP_verbose(Stream,PerRankVerbose,"Reader sent timestep list %p, trying to release %zd\n",__ptr,
             Timestep);
  p_Var3 = (_SentTimestepRec *)0x0;
  do {
    if (__ptr == (_SentTimestepRec *)0x0) {
      return;
    }
    p_Var5 = __ptr->Next;
    CP_verbose(Stream,TraceVerbose,"Reader considering sent timestep %ld,trying to release %zd\n",
               __ptr->Timestep,Timestep);
    Timestep_00 = __ptr->Timestep;
    p_Var4 = __ptr;
    if (Timestep_00 == Timestep) {
      SubRefTimestep(Stream,Timestep_00,SetLast);
      free(__ptr);
      pp_Var2 = &p_Var3->Next;
      if (p_Var3 == (_SentTimestepRec *)0x0) {
        pp_Var2 = &Reader->SentTimestepList;
      }
      *pp_Var2 = p_Var5;
      pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
      p_Var1 = Stream->DP_Interface->readerReleaseTimestep;
      if (p_Var1 != (CP_DP_PerReaderReleaseTimestepFunc)0x0) {
        (*p_Var1)(&Svcs,Reader->DP_WSR_Stream,Timestep);
      }
      pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
      p_Var4 = p_Var3;
      p_Var5 = __ptr;
    }
    p_Var3 = p_Var4;
    __ptr = p_Var5;
  } while (Timestep_00 != Timestep);
  return;
}

Assistant:

static void DerefSentTimestep(SstStream Stream, WS_ReaderInfo Reader, ssize_t Timestep)
{
    struct _SentTimestepRec *List = Reader->SentTimestepList, *Last = NULL;
    CP_verbose(Stream, PerRankVerbose, "Reader sent timestep list %p, trying to release %zd\n",
               (void *)Reader->SentTimestepList, Timestep);

    while (List)
    {

        int Freed = 0;
        struct _SentTimestepRec *Next = List->Next;
        CP_verbose(Stream, TraceVerbose,
                   "Reader considering sent timestep %ld,trying to release %zd\n", List->Timestep,
                   Timestep);
        if (List->Timestep == Timestep)
        {
            struct _SentTimestepRec *ItemToFree = List;
            Freed = 1;
            SubRefTimestep(Stream, ItemToFree->Timestep, 1);
            free(ItemToFree);
            if (Last)
            {
                Last->Next = Next;
            }
            else
            {
                Reader->SentTimestepList = Next;
            }
            /* per reader release here */
            STREAM_MUTEX_UNLOCK(Stream);
            if (Stream->DP_Interface->readerReleaseTimestep)
            {
                (Stream->DP_Interface->readerReleaseTimestep)(&Svcs, Reader->DP_WSR_Stream,
                                                              Timestep);
            }
            STREAM_MUTEX_LOCK(Stream);
            return;
        }
        if (!Freed)
        {
            Last = List;
        }
        List = Next;
    }
}